

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  undefined1 *puVar1;
  char cVar2;
  curl_slist *pcVar3;
  curl_trc_feat *pcVar4;
  Curl_addrinfo *pCVar5;
  char *pcVar6;
  ulong uVar7;
  size_t sVar8;
  Curl_addrinfo *pCVar9;
  size_t sVar10;
  void *pvVar11;
  Curl_dns_entry *pCVar12;
  char *pcVar13;
  char *pcVar14;
  int port;
  ulong in_R8;
  char *__s;
  ulong __n;
  size_t sVar16;
  Curl_addrinfo *pCVar17;
  char address [64];
  char entry_id [262];
  Curl_addrinfo *local_1b0;
  char *local_188;
  char *local_180;
  char local_178 [64];
  char local_138 [264];
  char *pcVar15;
  
  puVar1 = &(data->state).field_0x776;
  *puVar1 = *puVar1 & 0xfe;
  pcVar3 = (data->state).resolve;
  do {
    if (pcVar3 == (curl_slist *)0x0) {
      (data->state).resolve = (curl_slist *)0x0;
      return CURLE_OK;
    }
    pcVar14 = pcVar3->data;
    if (pcVar14 != (char *)0x0) {
      cVar2 = *pcVar14;
      if (cVar2 != '-') {
        pcVar14 = pcVar14 + (cVar2 == '+');
        pcVar6 = strchr(pcVar14,0x3a);
        if (pcVar6 != (char *)0x0) {
          uVar7 = strtoul(pcVar6 + 1,&local_188,10);
          if (uVar7 < 0x10000) {
            if ((local_188 == pcVar6 + 1) || (*local_188 != ':')) {
              local_1b0 = (Curl_addrinfo *)0x0;
              pcVar6 = local_188;
              goto LAB_00130d1e;
            }
            sVar16 = (long)pcVar6 - (long)pcVar14;
            local_180 = local_188 + 1;
            local_1b0 = (Curl_addrinfo *)0x0;
            pcVar13 = local_188;
            pCVar17 = (Curl_addrinfo *)0x0;
            do {
              __s = pcVar13 + 1;
              pcVar6 = strchr(__s,0x2c);
              if (pcVar6 == (char *)0x0) {
                sVar8 = strlen(__s);
                pcVar6 = __s + sVar8;
              }
              pcVar15 = pcVar6;
              if (*__s == '[') {
                if ((pcVar6 == __s) || (pcVar6[-1] != ']')) goto LAB_00130d1e;
                __s = pcVar13 + 2;
                pcVar15 = pcVar6 + -1;
              }
              __n = (long)pcVar15 - (long)__s;
              port = (int)uVar7;
              pCVar9 = pCVar17;
              pCVar5 = local_1b0;
              if (__n != 0) {
                if (0x3f < __n) goto LAB_00130d1e;
                memcpy(local_178,__s,__n);
                local_178[__n] = '\0';
                pCVar9 = Curl_str2addr(local_178,port);
                if (pCVar9 == (Curl_addrinfo *)0x0) {
                  if ((((data->set).field_0x8cd & 0x10) != 0) &&
                     ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar4->log_level)))) {
                    local_188 = pcVar6;
                    Curl_infof(data,"Resolve address \'%s\' found illegal",local_178);
                    pcVar6 = local_188;
                  }
                  goto LAB_00130d1e;
                }
                pCVar5 = pCVar9;
                if (pCVar17 != (Curl_addrinfo *)0x0) {
                  pCVar17->ai_next = pCVar9;
                  pCVar5 = local_1b0;
                }
              }
              local_1b0 = pCVar5;
              pcVar13 = pcVar6;
              pCVar17 = pCVar9;
            } while (*pcVar6 != '\0');
            if (local_1b0 == (Curl_addrinfo *)0x0) {
              local_1b0 = (Curl_addrinfo *)0x0;
              goto LAB_00130d1e;
            }
            local_188 = pcVar6;
            sVar10 = create_hostcache_id(pcVar14,sVar16,port,local_138,in_R8);
            if (data->share != (Curl_share *)0x0) {
              Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
            }
            pvVar11 = Curl_hash_pick((data->dns).hostcache,local_138,sVar10 + 1);
            if (pvVar11 != (void *)0x0) {
              if ((((data->set).field_0x8cd & 0x10) != 0) &&
                 ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar4->log_level)))) {
                Curl_infof(data,"RESOLVE %.*s:%d - old addresses discarded",sVar16,pcVar14,uVar7);
              }
              Curl_hash_delete((data->dns).hostcache,local_138,sVar10 + 1);
            }
            in_R8 = uVar7;
            pCVar12 = Curl_cache_addr(data,local_1b0,pcVar14,sVar16,port,cVar2 != '+');
            if (pCVar12 != (Curl_dns_entry *)0x0) {
              pCVar12->refcount = pCVar12->refcount - 1;
            }
            if (data->share != (Curl_share *)0x0) {
              Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
            }
            if (pCVar12 == (Curl_dns_entry *)0x0) {
              Curl_freeaddrinfo(local_1b0);
              return CURLE_OUT_OF_MEMORY;
            }
            if ((((data->set).field_0x8cd & 0x10) != 0) &&
               ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                (0 < pcVar4->log_level)))) {
              pcVar6 = " (non-permanent)";
              if (cVar2 != '+') {
                pcVar6 = "";
              }
              in_R8 = uVar7;
              Curl_infof(data,"Added %.*s:%d:%s to DNS cache%s",sVar16,pcVar14,uVar7,local_180,
                         pcVar6);
            }
            if ((sVar16 == 1) && (*pcVar14 == '*')) {
              if ((((data->set).field_0x8cd & 0x10) != 0) &&
                 ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar4->log_level)))) {
                Curl_infof(data,"RESOLVE *:%d using wildcard",uVar7);
              }
              puVar1 = &(data->state).field_0x776;
              *puVar1 = *puVar1 | 1;
            }
            goto LAB_00130cf3;
          }
        }
        local_1b0 = (Curl_addrinfo *)0x0;
        pcVar6 = local_188;
LAB_00130d1e:
        local_188 = pcVar6;
        Curl_failf(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'",pcVar3->data);
        Curl_freeaddrinfo(local_1b0);
        return CURLE_SETOPT_OPTION_SYNTAX;
      }
      pcVar6 = strchr(pcVar14 + 1,0x3a);
      if (pcVar6 != (char *)0x0) {
        uVar7 = strtoul(pcVar6 + 1,(char **)0x0,10);
        sVar16 = (long)pcVar6 - (long)(pcVar14 + 1);
        if (uVar7 < 0x10000 && sVar16 != 0) {
          sVar16 = create_hostcache_id(pcVar3->data + 1,sVar16,(int)uVar7,local_138,in_R8);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
          }
          Curl_hash_delete((data->dns).hostcache,local_138,sVar16 + 1);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
          }
          goto LAB_00130cf3;
        }
      }
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))))
      {
        Curl_infof(data,"Bad syntax CURLOPT_RESOLVE removal entry \'%s\'",pcVar3->data);
      }
    }
LAB_00130cf3:
    pcVar3 = pcVar3->next;
  } while( true );
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct curl_slist *hostp;
  char *host_end;

  /* Default is no wildcard found */
  data->state.wildcard_resolve = FALSE;

  for(hostp = data->state.resolve; hostp; hostp = hostp->next) {
    char entry_id[MAX_HOSTCACHE_LEN];
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      unsigned long num = 0;
      size_t entry_len;
      size_t hlen = 0;
      host_end = strchr(&hostp->data[1], ':');

      if(host_end) {
        hlen = host_end - &hostp->data[1];
        num = strtoul(++host_end, NULL, 10);
        if(!hlen || (num > 0xffff))
          host_end = NULL;
      }
      if(!host_end) {
        infof(data, "Bad syntax CURLOPT_RESOLVE removal entry '%s'",
              hostp->data);
        continue;
      }
      /* Create an entry id, based upon the hostname and port */
      entry_len = create_hostcache_id(&hostp->data[1], hlen, (int)num,
                                      entry_id, sizeof(entry_id));
      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* delete entry, ignore if it did not exist */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);
    }
    else {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *head = NULL, *tail = NULL;
      size_t entry_len;
      char address[64];
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      char *addresses = NULL;
#endif
      char *addr_begin;
      char *addr_end;
      char *port_ptr;
      int port = 0;
      char *end_ptr;
      bool permanent = TRUE;
      unsigned long tmp_port;
      bool error = TRUE;
      char *host_begin = hostp->data;
      size_t hlen = 0;

      if(host_begin[0] == '+') {
        host_begin++;
        permanent = FALSE;
      }
      host_end = strchr(host_begin, ':');
      if(!host_end)
        goto err;
      hlen = host_end - host_begin;

      port_ptr = host_end + 1;
      tmp_port = strtoul(port_ptr, &end_ptr, 10);
      if(tmp_port > USHRT_MAX || end_ptr == port_ptr || *end_ptr != ':')
        goto err;

      port = (int)tmp_port;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      addresses = end_ptr + 1;
#endif

      while(*end_ptr) {
        size_t alen;
        struct Curl_addrinfo *ai;

        addr_begin = end_ptr + 1;
        addr_end = strchr(addr_begin, ',');
        if(!addr_end)
          addr_end = addr_begin + strlen(addr_begin);
        end_ptr = addr_end;

        /* allow IP(v6) address within [brackets] */
        if(*addr_begin == '[') {
          if(addr_end == addr_begin || *(addr_end - 1) != ']')
            goto err;
          ++addr_begin;
          --addr_end;
        }

        alen = addr_end - addr_begin;
        if(!alen)
          continue;

        if(alen >= sizeof(address))
          goto err;

        memcpy(address, addr_begin, alen);
        address[alen] = '\0';

#ifndef USE_IPV6
        if(strchr(address, ':')) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.",
                address);
          continue;
        }
#endif

        ai = Curl_str2addr(address, port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
      }

      if(!head)
        goto err;

      error = FALSE;
err:
      if(error) {
        failf(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'",
              hostp->data);
        Curl_freeaddrinfo(head);
        return CURLE_SETOPT_OPTION_SYNTAX;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_len = create_hostcache_id(host_begin, hlen, port,
                                      entry_id, sizeof(entry_id));

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if it is already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

      if(dns) {
        infof(data, "RESOLVE %.*s:%d - old addresses discarded",
              (int)hlen, host_begin, port);
        /* delete old entry, there are two reasons for this
         1. old entry may have different addresses.
         2. even if entry with correct addresses is already in the cache,
            but if it is close to expire, then by the time next http
            request is made, it can get expired and pruned because old
            entry is not necessarily marked as permanent.
         3. when adding a non-permanent entry, we want it to remove and
            replace an existing permanent entry.
         4. when adding a non-permanent entry, we want it to get a "fresh"
            timeout that starts _now_. */

        Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
      }

      /* put this new host in the cache */
      dns = Curl_cache_addr(data, head, host_begin, hlen, port, permanent);
      if(dns) {
        /* release the returned reference; the cache itself will keep the
         * entry alive: */
        dns->refcount--;
      }

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      infof(data, "Added %.*s:%d:%s to DNS cache%s",
            (int)hlen, host_begin, port, addresses,
            permanent ? "" : " (non-permanent)");
#endif

      /* Wildcard hostname */
      if((hlen == 1) && (host_begin[0] == '*')) {
        infof(data, "RESOLVE *:%d using wildcard", port);
        data->state.wildcard_resolve = TRUE;
      }
    }
  }
  data->state.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}